

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

String * __thiscall kj::_::CidrRange::toString(String *__return_storage_ptr__,CidrRange *this)

{
  kj *pkVar1;
  uint *in_R8;
  Fault f;
  char result [128];
  Fault local_a0;
  kj local_98 [128];
  
  pkVar1 = (kj *)inet_ntop(this->family,this->bits,(char *)local_98,0x80);
  if (pkVar1 == local_98) {
    local_a0.exception._0_1_ = 0x2f;
    str<char(&)[128],char,unsigned_int_const&>
              (__return_storage_ptr__,local_98,(char (*) [128])&local_a0,(char *)&this->bitCount,
               in_R8);
    return __return_storage_ptr__;
  }
  Debug::Fault::Fault(&local_a0,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
                      ,0x83c,FAILED,
                      "inet_ntop(family, (void*)bits, result, sizeof(result)) == result","");
  Debug::Fault::fatal(&local_a0);
}

Assistant:

String CidrRange::toString() const {
  char result[128];
  KJ_ASSERT(inet_ntop(family, (void*)bits, result, sizeof(result)) == result);
  return kj::str(result, '/', bitCount);
}